

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt __thiscall llvm::APInt::multiplicativeInverse(APInt *this,APInt *modulo)

{
  uint numBits;
  void *pvVar1;
  bool bVar2;
  int iVar3;
  anon_union_8_2_1313ab2f_for_U aVar4;
  APInt *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  anon_union_8_2_1313ab2f_for_U *paVar9;
  ulong uVar10;
  APInt AVar11;
  APInt q;
  APInt t [2];
  undefined8 local_b8;
  anon_union_8_2_1313ab2f_for_U local_b0;
  anon_union_8_2_1313ab2f_for_U local_a8;
  uint local_a0;
  anon_union_8_2_1313ab2f_for_U local_98;
  uint local_90;
  APInt *local_88;
  APInt *local_80;
  anon_union_8_2_1313ab2f_for_U local_78;
  uint local_70 [2];
  anon_union_8_2_1313ab2f_for_U local_68;
  int aiStack_60 [2];
  anon_union_8_2_1313ab2f_for_U local_58 [3];
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  
  iVar3 = compare(modulo,in_RDX);
  if (-1 < iVar3) {
    __assert_fail("ult(modulo) && \"This APInt must be smaller than the modulo\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x452,"APInt llvm::APInt::multiplicativeInverse(const APInt &) const");
  }
  local_a0 = in_RDX->BitWidth;
  if ((ulong)local_a0 < 0x41) {
    aVar4 = in_RDX->U;
  }
  else {
    uVar6 = (ulong)((uint)((ulong)local_a0 + 0x3f >> 3) & 0xfffffff8);
    aVar4.pVal = (uint64_t *)operator_new__(uVar6);
    memcpy(aVar4.pVal,(in_RDX->U).pVal,uVar6);
  }
  paVar9 = &local_98;
  numBits = modulo->BitWidth;
  local_b0 = (anon_union_8_2_1313ab2f_for_U)this;
  local_a8 = aVar4;
  local_90 = numBits;
  local_80 = in_RDX;
  if ((ulong)numBits < 0x41) {
    aVar4 = modulo->U;
  }
  else {
    uVar6 = (ulong)((uint)((ulong)numBits + 0x3f >> 3) & 0xfffffff8);
    aVar4.pVal = (uint64_t *)operator_new__(uVar6);
    memcpy(aVar4.pVal,(modulo->U).pVal,uVar6);
  }
  uVar6 = 0;
  local_98 = aVar4;
  APInt((APInt *)&local_68,numBits,0,false);
  APInt((APInt *)local_58,modulo->BitWidth,1,false);
  APInt((APInt *)&local_78,modulo->BitWidth,0,false);
  bVar2 = operator==((APInt *)paVar9,0);
  if (!bVar2) {
    uVar7 = 1;
    uVar10 = uVar6;
    local_88 = modulo;
    do {
      uVar6 = uVar7;
      udivrem((APInt *)(&local_a8 + uVar10 * 2),(APInt *)paVar9,(APInt *)&local_78,
              (APInt *)(&local_a8 + uVar10 * 2));
      operator*((APInt *)&local_40,(APInt *)(&local_68 + uVar6 * 2));
      operator-=((APInt *)(&local_68 + uVar10 * 2),(APInt *)&local_40);
      if ((0x40 < local_38) && ((void *)local_40.VAL != (void *)0x0)) {
        operator_delete__(local_40.pVal);
      }
      uVar7 = (ulong)((uint)uVar6 ^ 1);
      paVar9 = &local_a8 + uVar7 * 2;
      bVar2 = operator==((APInt *)paVar9,0);
      uVar10 = uVar6;
      modulo = local_88;
    } while (!bVar2);
  }
  bVar2 = operator==((APInt *)(&local_a8 + uVar6 * 2),1);
  aVar4 = local_b0;
  if (bVar2) {
    paVar9 = &local_68 + uVar6 * 2;
    bVar2 = operator[]((APInt *)paVar9,aiStack_60[uVar6 * 4] - 1);
    uVar5 = extraout_RDX;
    if (bVar2) {
      operator+=((APInt *)paVar9,local_80);
      uVar5 = extraout_RDX_00;
    }
    *(int *)(local_b0.VAL + 8) = aiStack_60[uVar6 * 4];
    *local_b0.pVal = (uint64_t)*paVar9;
    aiStack_60[uVar6 * 4] = 0;
    aVar4 = local_b0;
  }
  else {
    APInt((APInt *)local_b0.pVal,modulo->BitWidth,0,false);
    uVar5 = extraout_RDX_01;
  }
  if ((0x40 < local_70[0]) && ((void *)local_78.VAL != (void *)0x0)) {
    operator_delete__(local_78.pVal);
    uVar5 = extraout_RDX_02;
  }
  lVar8 = 0x20;
  do {
    if ((0x40 < *(uint *)((long)local_70 + lVar8)) &&
       (pvVar1 = *(void **)((long)local_70 + lVar8 + -8), pvVar1 != (void *)0x0)) {
      operator_delete__(pvVar1);
      uVar5 = extraout_RDX_03;
    }
    lVar8 = lVar8 + -0x10;
  } while (lVar8 != 0);
  lVar8 = 0x20;
  do {
    if ((0x40 < *(uint *)((long)&local_b0 + lVar8)) &&
       (*(void **)((long)&local_b8 + lVar8) != (void *)0x0)) {
      operator_delete__(*(void **)((long)&local_b8 + lVar8));
      uVar5 = extraout_RDX_04;
    }
    lVar8 = lVar8 + -0x10;
  } while (lVar8 != 0);
  AVar11._8_8_ = uVar5;
  AVar11.U.VAL = aVar4.VAL;
  return AVar11;
}

Assistant:

APInt APInt::multiplicativeInverse(const APInt& modulo) const {
  assert(ult(modulo) && "This APInt must be smaller than the modulo");

  // Using the properties listed at the following web page (accessed 06/21/08):
  //   http://www.numbertheory.org/php/euclid.html
  // (especially the properties numbered 3, 4 and 9) it can be proved that
  // BitWidth bits suffice for all the computations in the algorithm implemented
  // below. More precisely, this number of bits suffice if the multiplicative
  // inverse exists, but may not suffice for the general extended Euclidean
  // algorithm.

  APInt r[2] = { modulo, *this };
  APInt t[2] = { APInt(BitWidth, 0), APInt(BitWidth, 1) };
  APInt q(BitWidth, 0);

  unsigned i;
  for (i = 0; r[i^1] != 0; i ^= 1) {
    // An overview of the math without the confusing bit-flipping:
    // q = r[i-2] / r[i-1]
    // r[i] = r[i-2] % r[i-1]
    // t[i] = t[i-2] - t[i-1] * q
    udivrem(r[i], r[i^1], q, r[i]);
    t[i] -= t[i^1] * q;
  }

  // If this APInt and the modulo are not coprime, there is no multiplicative
  // inverse, so return 0. We check this by looking at the next-to-last
  // remainder, which is the gcd(*this,modulo) as calculated by the Euclidean
  // algorithm.
  if (r[i] != 1)
    return APInt(BitWidth, 0);

  // The next-to-last t is the multiplicative inverse.  However, we are
  // interested in a positive inverse. Calculate a positive one from a negative
  // one if necessary. A simple addition of the modulo suffices because
  // abs(t[i]) is known to be less than *this/2 (see the link above).
  if (t[i].isNegative())
    t[i] += modulo;

  return std::move(t[i]);
}